

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall Timer::handleTick(Timer *this)

{
  uint uVar1;
  Node *pNVar2;
  int iVar3;
  TimerNode timer;
  AutoLock _auto_lock_;
  TimerNode local_70;
  AutoLock local_48;
  
  AutoLock::AutoLock(&local_48,&this->mMutex,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                     ,0xbb);
  this->mTicks = this->mTicks + 1;
  local_70.mEvent.mObj = (Event *)0x0;
  do {
    pNVar2 = ((this->mList).mHead)->next;
    if (pNVar2 == (this->mList).mTail) break;
    SmartPtr<Event>::operator=(&local_70.mEvent,(pNVar2->val).mEvent.mObj);
    local_70.mDispatcher = (pNVar2->val).mDispatcher;
    local_70.mListener = (pNVar2->val).mListener;
    local_70.mPrivateData = (pNVar2->val).mPrivateData;
    local_70.mTick = (pNVar2->val).mTick;
    local_70.mRepeatMS = (pNVar2->val).mRepeatMS;
    local_70.mRemainingMS = (pNVar2->val).mRemainingMS;
    iVar3 = local_70.mTick - this->mTicks;
    if (0 < iVar3) break;
    JetHead::list<Timer::TimerNode>::pop_front(&this->mList);
    if (local_70.mEvent.mObj == (Event *)0x0) {
      (*(code *)**(undefined8 **)local_70.mListener)
                (local_70.mListener,local_70._24_8_ & 0xffffffff);
    }
    else {
      (*(local_70.mDispatcher)->_vptr_IEventDispatcher[1])();
    }
    if (local_70.mRepeatMS == 0) {
      if (local_70.mEvent.mObj != (Event *)0x0) {
        RefCount::Release(&(local_70.mEvent.mObj)->super_RefCount);
      }
      local_70.mEvent.mObj = (Event *)0x0;
    }
    else {
      uVar1 = this->mMsPerTick;
      local_70.mTick =
           local_70.mTick + (~local_70.mRemainingMS + uVar1 + local_70.mRepeatMS) / uVar1;
      local_70.mRemainingMS = (local_70.mRemainingMS + local_70.mRepeatMS) % uVar1;
      addTimerNode(this,&local_70);
    }
  } while (iVar3 < 1);
  SmartPtr<Event>::~SmartPtr(&local_70.mEvent);
  AutoLock::~AutoLock(&local_48);
  return;
}

Assistant:

void Timer::handleTick()
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	DebugAutoLock( mMutex );
	
	mTicks++;
	
	TimerNode timer;
	
	while (not mList.empty())
	{
		timer = *mList.begin();
		
		int32_t diff = timer.mTick - mTicks;
		
		// List is sorted with nearest items first.  Once we find a node
		// that is in the future we are done.
		if ( diff > 0 )
			break;
		
		// Remove the timer from the list now
		mList.pop_front();

		// If the timer doesn't have an event then we call the listener
		if ( timer.mEvent == NULL )
		{
			timer.mListener->onTimeout( timer.mPrivateData );
		}
		// Otherwise send the event
		else
		{
			// Send the event to the specified dispatcher
			timer.mDispatcher->sendEvent( timer.mEvent );
		}
		
		// Check to see if this is a periodic timer.   If it is then
		// we need to re-calculate the tick value for the timer.  In
		// addition we are going to calculate the # of ms that are
		// lost by the tick calculation and accumulate them so that
		// over time we line up properly whenever possible.
		if (timer.mRepeatMS != 0)
		{
			unsigned newTicks = (timer.mRepeatMS + mMsPerTick - 1 - 
								 timer.mRemainingMS) / mMsPerTick;
			timer.mTick += newTicks;
			timer.mRemainingMS = (timer.mRepeatMS + timer.mRemainingMS) % 
				mMsPerTick;
			addTimerNode(timer);
		}
		// If this is a non-periodic then release our reference to
		// the event if we have one
		else
		{
			timer.mEvent = NULL;
		}
	}
}